

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O1

REF_STATUS
ref_cell_id_list_around_both
          (REF_CELL ref_cell_a,REF_CELL ref_cell_b,REF_INT node,REF_INT max_ids,REF_INT *n_ids,
          REF_INT *ids)

{
  int iVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  REF_INT RVar8;
  REF_INT nodes [27];
  REF_INT local_a8 [30];
  
  *n_ids = 0;
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < ref_cell_a->ref_adj->nnode) {
      uVar7 = (ulong)(uint)ref_cell_a->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    RVar8 = ref_cell_a->ref_adj->item[(int)uVar7].ref;
    do {
      uVar4 = ref_cell_nodes(ref_cell_a,RVar8,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x51a,"ref_cell_id_list_around_both",(ulong)uVar4,"nodes");
        return uVar4;
      }
      lVar5 = (long)*n_ids;
      if (lVar5 < 1) {
LAB_0013b518:
        if (max_ids <= *n_ids) {
          return 7;
        }
        ids[lVar5] = local_a8[ref_cell_a->node_per];
        *n_ids = *n_ids + 1;
      }
      else {
        lVar6 = 0;
        bVar3 = false;
        do {
          if (local_a8[ref_cell_a->node_per] == ids[lVar6]) {
            bVar3 = true;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        if (!bVar3) goto LAB_0013b518;
      }
      pRVar2 = ref_cell_a->ref_adj->item;
      iVar1 = pRVar2[(int)uVar7].next;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) {
        RVar8 = -1;
      }
      else {
        RVar8 = pRVar2[uVar7].ref;
      }
    } while (iVar1 != -1);
  }
  uVar7 = 0xffffffff;
  if (-1 < node) {
    uVar7 = 0xffffffff;
    if (node < ref_cell_b->ref_adj->nnode) {
      uVar7 = (ulong)(uint)ref_cell_b->ref_adj->first[(uint)node];
    }
  }
  if ((int)uVar7 != -1) {
    RVar8 = ref_cell_b->ref_adj->item[(int)uVar7].ref;
    do {
      uVar4 = ref_cell_nodes(ref_cell_b,RVar8,local_a8);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cell.c",
               0x52a,"ref_cell_id_list_around_both",(ulong)uVar4,"nodes");
        return uVar4;
      }
      lVar5 = (long)*n_ids;
      if (lVar5 < 1) {
LAB_0013b61a:
        if (max_ids <= *n_ids) {
          return 7;
        }
        ids[lVar5] = local_a8[ref_cell_b->node_per];
        *n_ids = *n_ids + 1;
      }
      else {
        lVar6 = 0;
        bVar3 = false;
        do {
          if (local_a8[ref_cell_b->node_per] == ids[lVar6]) {
            bVar3 = true;
          }
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar6);
        if (!bVar3) goto LAB_0013b61a;
      }
      pRVar2 = ref_cell_b->ref_adj->item;
      iVar1 = pRVar2[(int)uVar7].next;
      uVar7 = (ulong)iVar1;
      if (uVar7 == 0xffffffffffffffff) {
        RVar8 = -1;
      }
      else {
        RVar8 = pRVar2[uVar7].ref;
      }
    } while (iVar1 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cell_id_list_around_both(REF_CELL ref_cell_a,
                                                REF_CELL ref_cell_b,
                                                REF_INT node, REF_INT max_ids,
                                                REF_INT *n_ids, REF_INT *ids) {
  REF_INT item, cell, id, deg;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_BOOL already_have_it;
  REF_CELL ref_cell;

  *n_ids = 0;

  ref_cell = ref_cell_a;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  ref_cell = ref_cell_b;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    id = nodes[ref_cell_node_per(ref_cell)];
    already_have_it = REF_FALSE;
    for (deg = 0; deg < *n_ids; deg++)
      if (id == ids[deg]) already_have_it = REF_TRUE;
    if (!already_have_it) {
      if (*n_ids >= max_ids) {
        return REF_INCREASE_LIMIT;
      }
      ids[*n_ids] = id;
      (*n_ids)++;
    }
  }

  return REF_SUCCESS;
}